

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_insert_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t rs_num,uint32_t n)

{
  *(char *)((long)(env->active_fpu).fpr + (ulong)(n & 0xf) + (ulong)wd * 0x10) =
       (char)(env->active_tc).gpr[rs_num];
  return;
}

Assistant:

void helper_msa_insert_b(CPUMIPSState *env, uint32_t wd,
                          uint32_t rs_num, uint32_t n)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    target_ulong rs = env->active_tc.gpr[rs_num];
    n %= 16;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 8) {
        n = 8 - n - 1;
    } else {
        n = 24 - n - 1;
    }
#endif
    pwd->b[n] = (int8_t)rs;
}